

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O3

void __thiscall
txpackage_tests::package_sanitization_tests::test_method(package_sanitization_tests *this)

{
  FastRandomContext *this_00;
  pointer *ppCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  pointer *this_02;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  Span<std::byte> output;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  Span<std::byte> output_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  const_string file_15;
  const_string file_16;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  check_type cVar10;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 local_5b4 [4];
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  Package package_conflicts;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  Package package_duplicate_txids_empty;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  Package package_too_large;
  CTransactionRef large_ptx;
  unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> local_358;
  unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> local_350;
  char *local_348;
  SignalInterrupt *local_340;
  unique_ptr<AddrMan,_std::default_delete<AddrMan>_> local_338;
  unique_ptr<CConnman,_std::default_delete<CConnman>_> local_330;
  char *local_328;
  unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> local_320;
  char *local_318;
  unique_ptr<PeerManager,_std::default_delete<PeerManager>_> local_310;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> local_308;
  unique_ptr<BanMan,_std::default_delete<BanMan>_> local_300;
  char *local_2f8;
  pointer local_2f0;
  Package package_too_many;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [24];
  undefined1 local_298 [8];
  element_type *peStack_290;
  shared_count sStack_288;
  _Head_base<0UL,_node::KernelNotifications_*,_false> local_280;
  uint32_t local_278;
  CMutableTransaction dup_tx;
  Package package_with_dup_tx;
  uint256 ret_1;
  PackageValidationState state_conflicts;
  undefined1 local_1a8 [16];
  shared_count sStack_198;
  _List _Stack_190;
  uint32_t local_188;
  CMutableTransaction tx_zero_2;
  CMutableTransaction tx_zero_1;
  PackageValidationState state_duplicates;
  PackageValidationState state_too_large;
  PackageValidationState state_too_many;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  package_too_many.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_too_many.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_too_many.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = 0x1a;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::reserve(&package_too_many,0x1a);
  do {
    TxPackageTest::create_placeholder_tx((TxPackageTest *)&state_too_many,(size_t)this,1);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)&package_too_many,(shared_ptr<const_CTransaction> *)&state_too_many);
    if (state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
        _M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _M_dataplus._M_p);
    }
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  state_too_many.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_too_many.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length = 0
  ;
  state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
  [0] = '\0';
  state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length = 0
  ;
  state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._M_local_buf
  [0] = '\0';
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_2f0 = (pointer)0xf6c33a;
  local_308._M_t.super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
  _M_t.super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
  super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl =
       (__uniq_ptr_data<ChainstateManager,_std::default_delete<ChainstateManager>,_true,_true>)
       &boost::unit_test::basic_cstring<char_const>::null;
  local_300._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<BanMan,_std::default_delete<BanMan>,_true,_true>)
       &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8e;
  file.m_begin = (iterator)&local_2f8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_308,msg);
  _cVar10 = 0x6782e9;
  bVar4 = IsWellFormedPackage(&package_too_many,&state_too_many,true);
  state_duplicates.super_ValidationState<PackageValidationResult>.m_mode._0_1_ = !bVar4;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&state_conflicts;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = anon_var_dwarf_19a5919;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       "";
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013ae1c8
  ;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_310._M_t.super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
  super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
  super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl =
       (__uniq_ptr_data<PeerManager,_std::default_delete<PeerManager>,_true,_true>)
       ((long)
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
       + 0x61);
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&state_duplicates,(lazy_ostream *)&state_too_large,1,0,WARN,_cVar10
             ,(size_t)&local_318,0x8e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_320._M_t.
  super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>._M_t.
  super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
  super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_NetGroupManager,_std::default_delete<const_NetGroupManager>,_true,_true>
        )((long)
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
         + 0x61);
  local_338._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       &boost::unit_test::basic_cstring<char_const>::null;
  local_330._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
  super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
  super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
       (__uniq_ptr_data<CConnman,_std::default_delete<CConnman>,_true,_true>)
       &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x8f;
  file_00.m_begin = (iterator)&local_328;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_338,
             msg_00);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013ae088
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_298;
  local_298._0_4_ = state_too_many.super_ValidationState<PackageValidationResult>.m_result;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               state_too_many.super_ValidationState<PackageValidationResult>.
                               m_result == PCKG_POLICY);
  local_1a8._0_8_ = &ret_1;
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_19985d3;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf6c33a;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&dup_tx;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013b3220
  ;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_1a8;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_duplicates.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_013b3220;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx_zero_1,(lazy_ostream *)&state_conflicts,1,2,REQUIRE,0xf6c792,
             (size_t)&tx_zero_2,0x8f,(lazy_ostream *)&state_too_large,
             "PackageValidationResult::PCKG_POLICY",(assertion_result *)&state_duplicates);
  ppCVar1 = &tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  boost::detail::shared_count::~shared_count((shared_count *)ppCVar1);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_340 = (SignalInterrupt *)0xf6c33a;
  local_358._M_t.super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
  super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
  super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl =
       (__uniq_ptr_data<kernel::Context,_std::default_delete<kernel::Context>,_true,_true>)
       &boost::unit_test::basic_cstring<char_const>::null;
  local_350._M_t.super___uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>._M_t.
  super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
  super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
       (__uniq_ptr_data<ECC_Context,_std::default_delete<ECC_Context>,_true,_true>)
       &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x90;
  file_01.m_begin = (iterator)&local_348;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_358,
             msg_01);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013ae088
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppCVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&tx_zero_1,
             state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_dataplus._M_p,
             state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_dataplus._M_p +
             state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_string_length);
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx_zero_1
                     ,"package-too-many-transactions");
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,iVar5 == 0);
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_19985d3;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf6c33a;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013ae148
  ;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_1a8;
  local_298 = (undefined1  [8])0xf6c7f3;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_duplicates.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_013b3260;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_298;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_1a8._0_8_ = (ArgsManager *)&tx_zero_1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx_zero_2,(lazy_ostream *)&state_conflicts,1,2,REQUIRE,0xf6c7d2,
             (size_t)&dup_tx,0x90,(lazy_ostream *)&state_too_large,
             "\"package-too-many-transactions\"",(assertion_result *)&state_duplicates);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppCVar1) {
    operator_delete(tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->prevout).hash.
                            m_wrapped.super_base_blob<256U>.m_data._M_elems + 1));
  }
  TxPackageTest::create_placeholder_tx((TxPackageTest *)&large_ptx,(size_t)this,0x96);
  package_too_large.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_too_large.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_too_large.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &::TX_NO_WITNESS;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_duplicates;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (large_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&state_too_large,&::TX_NO_WITNESS
            );
  uVar3 = state_duplicates.super_ValidationState<PackageValidationResult>._0_8_;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &::TX_WITH_WITNESS;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_duplicates;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (large_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&state_too_large,
             &::TX_WITH_WITNESS);
  iVar5 = (ModeState)uVar3 * 3 +
          state_duplicates.super_ValidationState<PackageValidationResult>.m_mode;
  uVar7 = 0;
  do {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back(&package_too_large,&large_ptx);
    uVar7 = uVar7 + (long)iVar5;
  } while (uVar7 < 0x62a21);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x67879e;
  file_02.m_end = (iterator)0x9b;
  file_02.m_begin = (iterator)&local_398;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3a8,
             msg_02);
  state_duplicates.super_ValidationState<PackageValidationResult>.m_mode._0_1_ =
       (ulong)((long)package_too_large.
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)package_too_large.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) < 0x1a0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = anon_var_dwarf_19a599d;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       "";
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013ae1c8
  ;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3b0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)(lazy_ostream *)&state_conflicts;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&state_duplicates,(lazy_ostream *)&state_too_large,1,0,WARN,_cVar10
             ,(size_t)&local_3b8,0x9b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length);
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  state_too_large.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_too_large.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
       _M_allocated_capacity & 0xffffffffffffff00;
  state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
       0;
  state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
  _M_local_buf[0] = '\0';
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x9d;
  file_03.m_begin = (iterator)&local_3c8;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3d8,
             msg_03);
  _cVar10 = 0x6788be;
  bVar4 = IsWellFormedPackage(&package_too_large,&state_too_large,true);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_mode._0_1_ = !bVar4;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_19a59b3;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf6c89d;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_duplicates.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_013ae1c8;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3e0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)(ArgsManager *)&tx_zero_1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&state_conflicts,(lazy_ostream *)&state_duplicates,1,0,WARN,_cVar10
             ,(size_t)&local_3e8,0x9d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x9e;
  file_04.m_begin = (iterator)&local_3f8;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_408,
             msg_04);
  uVar3 = state_too_large.super_ValidationState<PackageValidationResult>._0_8_;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae088;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx_zero_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0xf73bdc;
  ret_1.super_base_blob<256U>.m_data._M_elems[0] =
       (undefined1)state_too_large.super_ValidationState<PackageValidationResult>.m_result;
  ret_1.super_base_blob<256U>.m_data._M_elems[1] =
       state_too_large.super_ValidationState<PackageValidationResult>.m_result._1_1_;
  ret_1.super_base_blob<256U>.m_data._M_elems[2] =
       state_too_large.super_ValidationState<PackageValidationResult>.m_result._2_1_;
  ret_1.super_base_blob<256U>.m_data._M_elems[3] =
       state_too_large.super_ValidationState<PackageValidationResult>.m_result._3_1_;
  local_298 = (undefined1  [8])&package_with_dup_tx;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               state_too_large.super_ValidationState<PackageValidationResult>.
                               m_result == PCKG_POLICY);
  package_with_dup_tx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(package_with_dup_tx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_19985d3;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf6c33a;
  local_1a8._0_8_ = &ret_1;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_duplicates.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_013b3220;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_1a8;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013b3220
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_298;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = uVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx_zero_2,(lazy_ostream *)&tx_zero_1,1,2,REQUIRE,0xf6c89e,
             (size_t)&dup_tx,0x9e,(lazy_ostream *)&state_duplicates,
             "PackageValidationResult::PCKG_POLICY",(assertion_result *)&state_conflicts);
  ppCVar1 = &tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  boost::detail::shared_count::~shared_count((shared_count *)ppCVar1);
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x9f;
  file_05.m_begin = (iterator)&local_418;
  msg_05.m_end = pvVar9;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_428,
             msg_05);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae088;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx_zero_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0xf73bdc;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppCVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&tx_zero_2,
             state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_dataplus._M_p,
             state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_dataplus._M_p +
             state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_string_length);
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx_zero_2
                     ,"package-too-large");
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,iVar5 == 0);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1a8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_1a8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
       + 0x61;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_duplicates.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_013ae148;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_298;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_19a59dd;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013af870
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&ret_1;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_298 = (undefined1  [8])&tx_zero_2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dup_tx,(lazy_ostream *)&tx_zero_1,1,2,REQUIRE,0xf6c8ba,
             (size_t)local_1a8,0x9f,(lazy_ostream *)&state_duplicates,"\"package-too-large\"",
             (assertion_result *)&state_conflicts);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppCVar1) {
    operator_delete(tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->prevout).hash.
                            m_wrapped.super_base_blob<256U>.m_data._M_elems + 1));
  }
  package_duplicate_txids_empty.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_duplicate_txids_empty.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_duplicate_txids_empty.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = 3;
  do {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&state_duplicates);
    state_conflicts.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
    state_conflicts.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason,
               (CTransaction **)&state_conflicts,(allocator<CTransaction> *)&tx_zero_1,
               (CMutableTransaction *)&state_duplicates);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)&package_duplicate_txids_empty,(shared_ptr<const_CTransaction> *)&state_conflicts)
    ;
    if (state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
        _M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _M_dataplus._M_p);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               &state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
                field_2);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&state_duplicates);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
       _M_allocated_capacity & 0xffffffffffffff00;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
       0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
  _M_local_buf[0] = '\0';
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xa8;
  file_06.m_begin = (iterator)&local_458;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_468,
             msg_06);
  _cVar10 = 0x678daa;
  bVar4 = IsWellFormedPackage(&package_duplicate_txids_empty,&state_duplicates,true);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,!bVar4);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_19a59f1;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf6c94d;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013ae1c8
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_470 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&tx_zero_2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx_zero_1,(lazy_ostream *)&state_conflicts,1,0,WARN,_cVar10,
             (size_t)&local_478,0xa8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xa9;
  file_07.m_begin = (iterator)&local_488;
  msg_07.m_end = pvVar9;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_498,
             msg_07);
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae088;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx_zero_2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0xf73bdc;
  package_with_dup_tx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(package_with_dup_tx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         state_duplicates.super_ValidationState<PackageValidationResult>.m_result);
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = local_2b0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,
                               state_duplicates.super_ValidationState<PackageValidationResult>.
                               m_result == PCKG_POLICY);
  local_2b0._0_4_ = 1;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1a8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_1a8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
       + 0x61;
  local_298 = (undefined1  [8])&package_with_dup_tx;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013b3220
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_298;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013b3220;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx_zero_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)&ret_1;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dup_tx,(lazy_ostream *)&tx_zero_2,1,2,REQUIRE,0xf6c94e,
             (size_t)local_1a8,0xa9,(lazy_ostream *)&state_conflicts,
             "PackageValidationResult::PCKG_POLICY",&tx_zero_1);
  ppCVar1 = &dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  boost::detail::shared_count::~shared_count((shared_count *)ppCVar1);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xaa;
  file_08.m_begin = (iterator)&local_4a8;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4b8,
             msg_08);
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae088;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx_zero_2.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0xf73bdc;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppCVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&dup_tx,
             state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_dataplus._M_p,
             state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_dataplus._M_p +
             state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_string_length);
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dup_tx,
                     "package-contains-duplicates");
  local_1a8[0] = iVar5 == 0;
  local_1a8._8_8_ = 0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_298 = (undefined1  [8])0xf6c2d9;
  peStack_290 = (element_type *)0xf6c33a;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013ae148
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&ret_1;
  package_with_dup_tx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_19a5a33;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013b0e98;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx_zero_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)&package_with_dup_tx;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &dup_tx;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)&tx_zero_2,1,2,REQUIRE,0xf6c96b,
             (size_t)local_298,0xaa,(lazy_ostream *)&state_conflicts,
             "\"package-contains-duplicates\"",&tx_zero_1);
  boost::detail::shared_count::~shared_count(&sStack_198);
  if (dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)ppCVar1) {
    operator_delete(dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage)->prevout).hash.m_wrapped.
                            super_base_blob<256U>.m_data._M_elems + 1));
  }
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xab;
  file_09.m_begin = (iterator)&local_4c8;
  msg_09.m_end = pvVar9;
  msg_09.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4d8,
             msg_09);
  _cVar10 = 0x6791c5;
  bVar4 = IsConsistentPackage(&package_duplicate_txids_empty);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,!bVar4);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_19a5a47;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf6c9fb;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013ae1c8
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4e0 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&tx_zero_2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx_zero_1,(lazy_ostream *)&state_conflicts,1,0,WARN,_cVar10,
             (size_t)&local_4e8,0xab);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CMutableTransaction::CMutableTransaction(&tx_zero_1);
  CMutableTransaction::CMutableTransaction(&tx_zero_2);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_rng;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = 0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  output.m_size = 0x20;
  output.m_data = (byte *)&state_conflicts;
  FastRandomContext::fillrand(this_00,output);
  sStack_198.pi_ =
       (sp_counted_base *)
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_string_length;
  _Stack_190._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
           _M_allocated_capacity;
  local_1a8._0_4_ = state_conflicts.super_ValidationState<PackageValidationResult>.m_mode;
  local_1a8._4_4_ = state_conflicts.super_ValidationState<PackageValidationResult>.m_result;
  local_1a8._8_8_ =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p;
  local_188 = 0;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint&>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&tx_zero_1,(COutPoint *)local_1a8);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint&>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&tx_zero_2,(COutPoint *)local_1a8);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript_const&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&tx_zero_1.vout,&CENT,&P2WSH_OP_TRUE);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_mode = 2000000;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript_const&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&tx_zero_2.vout,(long *)&state_conflicts,
             &P2WSH_OP_TRUE);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason,
             (CTransaction **)&state_conflicts,(allocator<CTransaction> *)&dup_tx,&tx_zero_1);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  this_01 = &state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this_01->_M_allocated_capacity,
             (CTransaction **)
             &state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length,(allocator<CTransaction> *)&dup_tx,&tx_zero_2);
  __l._M_len = 2;
  __l._M_array = (iterator)&state_conflicts;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_conflicts,__l,(allocator_type *)&dup_tx);
  lVar6 = 0x20;
  do {
    this_03 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               (ret_1.super_base_blob<256U>.m_data._M_elems + lVar6 + 0x18);
    if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
    }
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != 0);
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xb7;
  file_10.m_begin = (iterator)&local_510;
  msg_10.m_end = pvVar9;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_520,
             msg_10);
  _cVar10 = 0x679418;
  bVar4 = IsConsistentPackage(&package_conflicts);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,!bVar4);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_298 = (undefined1  [8])0xf6c9fc;
  peStack_290 = (element_type *)0xf6ca23;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013ae1c8
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_528 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_298;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dup_tx,(lazy_ostream *)&state_conflicts,1,0,WARN,_cVar10,
             (size_t)&local_530,0xb7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xb9;
  file_11.m_begin = (iterator)&local_540;
  msg_11.m_end = pvVar9;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_550,
             msg_11);
  _cVar10 = 0x6794f3;
  bVar4 = IsTopoSortedPackage(&package_conflicts);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,bVar4);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_298 = (undefined1  [8])0xf6ca24;
  peStack_290 = (element_type *)0xf6ca4a;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013ae1c8
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_558 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_298;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dup_tx,(lazy_ostream *)&state_conflicts,1,0,WARN,_cVar10,
             (size_t)&local_560,0xb9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
       _M_allocated_capacity & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
       0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
  _M_local_buf[0] = '\0';
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xbb;
  file_12.m_begin = (iterator)&local_570;
  msg_12.m_end = pvVar9;
  msg_12.m_begin = pvVar8;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)this_01;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_580,
             msg_12);
  _cVar10 = 0x679601;
  bVar4 = IsWellFormedPackage(&package_conflicts,&state_conflicts,true);
  local_298[0] = !bVar4;
  peStack_290 = (element_type *)0x0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_19a5a8b;
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!IsWellFormedPackage(package_conflicts, state_conflicts, true)" + 0x3e;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  dup_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&ret_1;
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_588 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_298,(lazy_ostream *)&dup_tx,1,0,WARN,_cVar10,
             (size_t)&local_590,0xbb);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xbc;
  file_13.m_begin = (iterator)&local_5a0;
  msg_13.m_end = pvVar9;
  msg_13.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5b0,
             msg_13);
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae088;
  ret_1.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2c0._0_8_ = local_2d0;
  local_2d0._0_4_ = state_conflicts.super_ValidationState<PackageValidationResult>.m_result;
  local_2d0._8_8_ = local_5b4;
  local_5b4 = (undefined1  [4])0x1;
  package_with_dup_tx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(package_with_dup_tx.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         state_conflicts.super_ValidationState<PackageValidationResult>.m_result ==
                         PCKG_POLICY);
  package_with_dup_tx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_with_dup_tx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_2b0._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
       + 0x61;
  dup_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2c0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013b3220;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  peStack_290 = (element_type *)((ulong)peStack_290 & 0xffffffffffffff00);
  local_298 = (undefined1  [8])&PTR__lazy_ostream_013b3220;
  sStack_288.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_280._M_head_impl = (KernelNotifications *)((long)local_2d0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&package_with_dup_tx,(lazy_ostream *)&ret_1,1,2,REQUIRE,0xf6ca8a,
             (size_t)local_2b0,0xbc,&dup_tx,"PackageValidationResult::PCKG_POLICY",
             (assertion_result *)local_298);
  this_02 = &package_with_dup_tx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  boost::detail::shared_count::~shared_count((shared_count *)this_02);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xbd;
  file_14.m_begin = (iterator)&local_5c8;
  msg_14.m_end = pvVar9;
  msg_14.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5d8,
             msg_14);
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae088;
  ret_1.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  package_with_dup_tx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_02;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&package_with_dup_tx,
             state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_dataplus._M_p,
             state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_dataplus._M_p +
             state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_string_length);
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &package_with_dup_tx,"conflict-in-package");
  local_2b0[0] = iVar5 == 0;
  local_2b0._8_8_ = (__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>)0x0;
  local_2b0._16_8_ = (void *)0x0;
  local_2c0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_2c0._8_8_ = "";
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013ae148;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_2d0._0_8_ = "conflict-in-package";
  peStack_290 = (element_type *)((ulong)peStack_290 & 0xffffffffffffff00);
  local_298 = (undefined1  [8])&PTR__lazy_ostream_013b0dc8;
  sStack_288.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_280._M_head_impl = (KernelNotifications *)local_2d0;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  local_2d0._8_8_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&package_with_dup_tx;
  dup_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)local_2d0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2b0,(lazy_ostream *)&ret_1,1,2,REQUIRE,0xf6caa6,
             (size_t)local_2c0,0xbd,&dup_tx,"\"conflict-in-package\"",local_298);
  boost::detail::shared_count::~shared_count((shared_count *)(local_2b0 + 0x10));
  if (package_with_dup_tx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)this_02) {
    operator_delete(package_with_dup_tx.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((package_with_dup_tx.
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + 1));
  }
  CMutableTransaction::CMutableTransaction(&dup_tx);
  ret_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output_00.m_size = 0x20;
  output_00.m_data = (byte *)&ret_1;
  FastRandomContext::fillrand(this_00,output_00);
  sStack_288.pi_ = (sp_counted_base *)ret_1.super_base_blob<256U>.m_data._M_elems._16_8_;
  local_280._M_head_impl = (KernelNotifications *)ret_1.super_base_blob<256U>.m_data._M_elems._24_8_
  ;
  local_298[0] = ret_1.super_base_blob<256U>.m_data._M_elems[0];
  local_298[1] = ret_1.super_base_blob<256U>.m_data._M_elems[1];
  local_298[2] = ret_1.super_base_blob<256U>.m_data._M_elems[2];
  local_298[3] = ret_1.super_base_blob<256U>.m_data._M_elems[3];
  local_298[4] = ret_1.super_base_blob<256U>.m_data._M_elems[4];
  local_298[5] = ret_1.super_base_blob<256U>.m_data._M_elems[5];
  local_298[6] = ret_1.super_base_blob<256U>.m_data._M_elems[6];
  local_298[7] = ret_1.super_base_blob<256U>.m_data._M_elems[7];
  peStack_290 = (element_type *)ret_1.super_base_blob<256U>.m_data._M_elems._8_8_;
  local_278 = 0;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint_const&>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&dup_tx,(COutPoint *)local_298);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint_const&>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&dup_tx,(COutPoint *)local_298);
  ret_1.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret_1.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (ret_1.super_base_blob<256U>.m_data._M_elems + 8),(CTransaction **)&ret_1,
             (allocator<CTransaction> *)local_2b0,&dup_tx);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&ret_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_with_dup_tx,__l_00,(allocator_type *)local_2b0);
  if (ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ret_1.super_base_blob<256U>.m_data._M_elems._8_8_);
  }
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xc6;
  file_15.m_begin = (iterator)&local_5e8;
  msg_15.m_end = pvVar9;
  msg_15.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_5f8,
             msg_15);
  _cVar10 = 0x679ae4;
  bVar4 = IsConsistentPackage(&package_with_dup_tx);
  local_2b0[0] = bVar4;
  local_2b0._8_8_ = (__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>)0x0;
  local_2b0._16_8_ = (void *)0x0;
  local_2c0._0_8_ = "IsConsistentPackage(package_with_dup_tx)";
  local_2c0._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
  ret_1.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_600 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_2c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2b0,(lazy_ostream *)&ret_1,1,0,WARN,_cVar10,
             (size_t)&local_608,0xc6);
  boost::detail::shared_count::~shared_count((shared_count *)(local_2b0 + 0x10));
  TxPackageTest::create_placeholder_tx((TxPackageTest *)&ret_1,(size_t)this,1);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&package_with_dup_tx,(shared_ptr<const_CTransaction> *)&ret_1);
  if (ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ret_1.super_base_blob<256U>.m_data._M_elems._8_8_);
  }
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xc8;
  file_16.m_begin = (iterator)&local_618;
  msg_16.m_end = pvVar9;
  msg_16.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_628,
             msg_16);
  _cVar10 = 0x679c04;
  bVar4 = IsConsistentPackage(&package_with_dup_tx);
  local_2b0[0] = bVar4;
  local_2b0._8_8_ = (__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>)0x0;
  local_2b0._16_8_ = (void *)0x0;
  local_2c0._0_8_ = "IsConsistentPackage(package_with_dup_tx)";
  local_2c0._8_8_ = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ret_1.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  ret_1.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae1c8;
  ret_1.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_630 = "";
  ret_1.super_base_blob<256U>.m_data._M_elems._24_8_ = local_2c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2b0,(lazy_ostream *)&ret_1,1,0,WARN,_cVar10,
             (size_t)&local_638,200);
  boost::detail::shared_count::~shared_count((shared_count *)(local_2b0 + 0x10));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_with_dup_tx);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&dup_tx.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&dup_tx.vin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
         _M_p !=
      &state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message.field_2) {
    operator_delete(state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message.
                    _M_dataplus._M_p,
                    CONCAT71(state_conflicts.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_allocated_capacity._1_7_,
                             state_conflicts.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
         _M_p !=
      &state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2) {
    operator_delete(state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    _M_dataplus._M_p,
                    state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_conflicts);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx_zero_2.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx_zero_2.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx_zero_1.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx_zero_1.vin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus
         ._M_p !=
      &state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message.field_2) {
    operator_delete(state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message.
                    _M_dataplus._M_p,
                    CONCAT71(state_duplicates.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_allocated_capacity._1_7_,
                             state_duplicates.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
         ._M_p !=
      &state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2) {
    operator_delete(state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    _M_dataplus._M_p,
                    state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_duplicate_txids_empty);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
         _M_p !=
      &state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message.field_2) {
    operator_delete(state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message.
                    _M_dataplus._M_p,
                    CONCAT71(state_too_large.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_allocated_capacity._1_7_,
                             state_too_large.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
         _M_p !=
      &state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2) {
    operator_delete(state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    _M_dataplus._M_p,
                    state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_too_large);
  if (large_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (large_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
         _M_p !=
      &state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message.field_2) {
    operator_delete(state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message.
                    _M_dataplus._M_p,
                    CONCAT71(state_too_many.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_allocated_capacity._1_7_,
                             state_too_many.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
         _M_p !=
      &state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2) {
    operator_delete(state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    _M_dataplus._M_p,
                    CONCAT71(state_too_many.super_ValidationState<PackageValidationResult>.
                             m_reject_reason.field_2._M_allocated_capacity._1_7_,
                             state_too_many.super_ValidationState<PackageValidationResult>.
                             m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_too_many);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_sanitization_tests)
{
    // Packages can't have more than 25 transactions.
    Package package_too_many;
    package_too_many.reserve(MAX_PACKAGE_COUNT + 1);
    for (size_t i{0}; i < MAX_PACKAGE_COUNT + 1; ++i) {
        package_too_many.emplace_back(create_placeholder_tx(1, 1));
    }
    PackageValidationState state_too_many;
    BOOST_CHECK(!IsWellFormedPackage(package_too_many, state_too_many, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_too_many.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_too_many.GetRejectReason(), "package-too-many-transactions");

    // Packages can't have a total weight of more than 404'000WU.
    CTransactionRef large_ptx = create_placeholder_tx(150, 150);
    Package package_too_large;
    auto size_large = GetTransactionWeight(*large_ptx);
    size_t total_weight{0};
    while (total_weight <= MAX_PACKAGE_WEIGHT) {
        package_too_large.push_back(large_ptx);
        total_weight += size_large;
    }
    BOOST_CHECK(package_too_large.size() <= MAX_PACKAGE_COUNT);
    PackageValidationState state_too_large;
    BOOST_CHECK(!IsWellFormedPackage(package_too_large, state_too_large, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_too_large.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_too_large.GetRejectReason(), "package-too-large");

    // Packages can't contain transactions with the same txid.
    Package package_duplicate_txids_empty;
    for (auto i{0}; i < 3; ++i) {
        CMutableTransaction empty_tx;
        package_duplicate_txids_empty.emplace_back(MakeTransactionRef(empty_tx));
    }
    PackageValidationState state_duplicates;
    BOOST_CHECK(!IsWellFormedPackage(package_duplicate_txids_empty, state_duplicates, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_duplicates.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_duplicates.GetRejectReason(), "package-contains-duplicates");
    BOOST_CHECK(!IsConsistentPackage(package_duplicate_txids_empty));

    // Packages can't have transactions spending the same prevout
    CMutableTransaction tx_zero_1;
    CMutableTransaction tx_zero_2;
    COutPoint same_prevout{Txid::FromUint256(m_rng.rand256()), 0};
    tx_zero_1.vin.emplace_back(same_prevout);
    tx_zero_2.vin.emplace_back(same_prevout);
    // Different vouts (not the same tx)
    tx_zero_1.vout.emplace_back(CENT, P2WSH_OP_TRUE);
    tx_zero_2.vout.emplace_back(2 * CENT, P2WSH_OP_TRUE);
    Package package_conflicts{MakeTransactionRef(tx_zero_1), MakeTransactionRef(tx_zero_2)};
    BOOST_CHECK(!IsConsistentPackage(package_conflicts));
    // Transactions are considered sorted when they have no dependencies.
    BOOST_CHECK(IsTopoSortedPackage(package_conflicts));
    PackageValidationState state_conflicts;
    BOOST_CHECK(!IsWellFormedPackage(package_conflicts, state_conflicts, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_conflicts.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_conflicts.GetRejectReason(), "conflict-in-package");

    // IsConsistentPackage only cares about conflicts between transactions, not about a transaction
    // conflicting with itself (i.e. duplicate prevouts in vin).
    CMutableTransaction dup_tx;
    const COutPoint rand_prevout{Txid::FromUint256(m_rng.rand256()), 0};
    dup_tx.vin.emplace_back(rand_prevout);
    dup_tx.vin.emplace_back(rand_prevout);
    Package package_with_dup_tx{MakeTransactionRef(dup_tx)};
    BOOST_CHECK(IsConsistentPackage(package_with_dup_tx));
    package_with_dup_tx.emplace_back(create_placeholder_tx(1, 1));
    BOOST_CHECK(IsConsistentPackage(package_with_dup_tx));
}